

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.cpp
# Opt level: O3

void embree::SceneGraph::set_motion_vector(Ref<embree::SceneGraph::Node> *node,Vec3fa *dP)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  Node *pNVar3;
  undefined8 uVar4;
  size_t sVar5;
  long *plVar6;
  Vec3fx *pVVar7;
  long lVar8;
  float *pfVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  float *pfVar13;
  Vec3fx *pVVar14;
  ulong uVar15;
  vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_> local_80;
  Vec3fa *local_60;
  float local_58;
  float fStack_54;
  float fStack_50;
  float fStack_4c;
  Ref<embree::SceneGraph::Node> local_40;
  Ref<embree::SceneGraph::Node> local_38;
  
  pNVar3 = node->ptr;
  if (pNVar3 != (Node *)0x0) {
    plVar6 = (long *)__dynamic_cast(pNVar3,&Node::typeinfo,&TransformNode::typeinfo,0);
    if (plVar6 == (long *)0x0) {
      plVar6 = (long *)__dynamic_cast(pNVar3,&Node::typeinfo,&GroupNode::typeinfo,0);
      if (plVar6 == (long *)0x0) {
        plVar6 = (long *)__dynamic_cast(pNVar3,&Node::typeinfo,&TriangleMeshNode::typeinfo,0);
        local_60 = dP;
        if (plVar6 == (long *)0x0) {
          plVar6 = (long *)__dynamic_cast(pNVar3,&Node::typeinfo,&QuadMeshNode::typeinfo,0);
          if (plVar6 == (long *)0x0) {
            plVar6 = (long *)__dynamic_cast(pNVar3,&Node::typeinfo,&GridMeshNode::typeinfo,0);
            if (plVar6 == (long *)0x0) {
              plVar6 = (long *)__dynamic_cast(pNVar3,&Node::typeinfo,&HairSetNode::typeinfo,0);
              if (plVar6 == (long *)0x0) {
                plVar6 = (long *)__dynamic_cast(pNVar3,&Node::typeinfo,&PointSetNode::typeinfo,0);
                if (plVar6 == (long *)0x0) {
                  plVar6 = (long *)__dynamic_cast(pNVar3,&Node::typeinfo,&SubdivMeshNode::typeinfo,0
                                                 );
                  if (plVar6 != (long *)0x0) {
                    (**(code **)(*plVar6 + 0x10))(plVar6);
                    local_80.size_active = 0;
                    local_80.size_alloced = 0;
                    local_80.items = (Vec3fx *)0x0;
                    lVar8 = *(long *)(plVar6[0xf] + -0x18);
                    if (lVar8 != 0) {
                      pfVar13 = *(float **)(plVar6[0xf] + -8);
                      pfVar9 = pfVar13 + lVar8 * 4;
                      pVVar14 = (Vec3fx *)0x0;
                      uVar10 = 0;
                      do {
                        sVar5 = local_80.size_active;
                        local_58 = *pfVar13 + (local_60->field_0).m128[0];
                        fStack_54 = pfVar13[1] + (local_60->field_0).m128[1];
                        fStack_50 = pfVar13[2] + (local_60->field_0).m128[2];
                        fStack_4c = pfVar13[3] + (local_60->field_0).m128[3];
                        uVar11 = local_80.size_active + 1;
                        if (uVar10 < uVar11) {
                          uVar15 = uVar11;
                          uVar12 = uVar10;
                          if (uVar10 != 0) {
                            do {
                              uVar15 = uVar12 * 2 + (ulong)(uVar12 * 2 == 0);
                              uVar12 = uVar15;
                            } while (uVar15 < uVar11);
                          }
                          if (uVar10 != uVar15) {
                            pVVar7 = (Vec3fx *)alignedMalloc(uVar15 << 4,0x10);
                            if (sVar5 != 0) {
                              lVar8 = 0;
                              uVar10 = 0;
                              do {
                                puVar1 = (undefined8 *)((long)&pVVar14->field_0 + lVar8);
                                uVar4 = puVar1[1];
                                puVar2 = (undefined8 *)((long)&pVVar7->field_0 + lVar8);
                                *puVar2 = *puVar1;
                                puVar2[1] = uVar4;
                                uVar10 = uVar10 + 1;
                                lVar8 = lVar8 + 0x10;
                              } while (uVar10 < sVar5);
                            }
                            local_80.items = pVVar7;
                            alignedFree(pVVar14);
                            pVVar14 = pVVar7;
                            uVar10 = uVar15;
                            local_80.size_alloced = uVar15;
                          }
                        }
                        *(ulong *)&pVVar14[sVar5].field_0 = CONCAT44(fStack_54,local_58);
                        *(ulong *)((long)&pVVar14[sVar5].field_0 + 8) =
                             CONCAT44(fStack_4c,fStack_50);
                        pfVar13 = pfVar13 + 4;
                        local_80.size_active = uVar11;
                      } while (pfVar13 != pfVar9);
                    }
                    std::
                    vector<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>,std::allocator<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>>>
                    ::
                    emplace_back<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>>
                              ((vector<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>,std::allocator<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>>>
                                *)(plVar6 + 0xe),
                               (vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>
                                *)&local_80);
                    alignedFree(local_80.items);
                    (**(code **)(*plVar6 + 0x18))(plVar6);
                  }
                }
                else {
                  (**(code **)(*plVar6 + 0x10))(plVar6);
                  local_80.size_active = 0;
                  local_80.size_alloced = 0;
                  local_80.items = (Vec3fx *)0x0;
                  lVar8 = *(long *)(plVar6[0x10] + -0x18);
                  if (lVar8 != 0) {
                    pfVar13 = *(float **)(plVar6[0x10] + -8);
                    pfVar9 = pfVar13 + lVar8 * 4;
                    pVVar14 = (Vec3fx *)0x0;
                    uVar10 = 0;
                    do {
                      sVar5 = local_80.size_active;
                      local_58 = (local_60->field_0).m128[0] + *pfVar13;
                      fStack_54 = (local_60->field_0).m128[1] + pfVar13[1];
                      fStack_50 = (local_60->field_0).m128[2] + pfVar13[2];
                      fStack_4c = pfVar13[3] + 0.0;
                      uVar11 = local_80.size_active + 1;
                      if (uVar10 < uVar11) {
                        uVar15 = uVar11;
                        uVar12 = uVar10;
                        if (uVar10 != 0) {
                          do {
                            uVar15 = uVar12 * 2 + (ulong)(uVar12 * 2 == 0);
                            uVar12 = uVar15;
                          } while (uVar15 < uVar11);
                        }
                        if (uVar10 != uVar15) {
                          pVVar7 = (Vec3fx *)alignedMalloc(uVar15 << 4,0x10);
                          if (sVar5 != 0) {
                            lVar8 = 0;
                            uVar10 = 0;
                            do {
                              puVar1 = (undefined8 *)((long)&pVVar14->field_0 + lVar8);
                              uVar4 = puVar1[1];
                              puVar2 = (undefined8 *)((long)&pVVar7->field_0 + lVar8);
                              *puVar2 = *puVar1;
                              puVar2[1] = uVar4;
                              uVar10 = uVar10 + 1;
                              lVar8 = lVar8 + 0x10;
                            } while (uVar10 < sVar5);
                          }
                          local_80.items = pVVar7;
                          alignedFree(pVVar14);
                          uVar10 = uVar15;
                          pVVar14 = pVVar7;
                          local_80.size_alloced = uVar15;
                        }
                      }
                      *(ulong *)&pVVar14[sVar5].field_0 = CONCAT44(fStack_54,local_58);
                      *(ulong *)((long)&pVVar14[sVar5].field_0 + 8) = CONCAT44(fStack_4c,fStack_50);
                      pfVar13 = pfVar13 + 4;
                      local_80.size_active = uVar11;
                    } while (pfVar13 != pfVar9);
                  }
                  std::
                  vector<embree::vector_t<embree::Vec3fx,embree::aligned_allocator<embree::Vec3fx,16ul>>,std::allocator<embree::vector_t<embree::Vec3fx,embree::aligned_allocator<embree::Vec3fx,16ul>>>>
                  ::
                  emplace_back<embree::vector_t<embree::Vec3fx,embree::aligned_allocator<embree::Vec3fx,16ul>>>
                            ((vector<embree::vector_t<embree::Vec3fx,embree::aligned_allocator<embree::Vec3fx,16ul>>,std::allocator<embree::vector_t<embree::Vec3fx,embree::aligned_allocator<embree::Vec3fx,16ul>>>>
                              *)(plVar6 + 0xf),&local_80);
                  if ((value_type *)plVar6[0x13] != (value_type *)plVar6[0x12]) {
                    std::
                    vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                    ::push_back((vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                                 *)(plVar6 + 0x12),(value_type *)plVar6[0x12]);
                  }
                  alignedFree(local_80.items);
                  (**(code **)(*plVar6 + 0x18))(plVar6);
                }
              }
              else {
                (**(code **)(*plVar6 + 0x10))(plVar6);
                local_80.size_active = 0;
                local_80.size_alloced = 0;
                local_80.items = (Vec3fx *)0x0;
                lVar8 = *(long *)(plVar6[0x10] + -0x18);
                if (lVar8 != 0) {
                  pfVar13 = *(float **)(plVar6[0x10] + -8);
                  pfVar9 = pfVar13 + lVar8 * 4;
                  pVVar14 = (Vec3fx *)0x0;
                  uVar10 = 0;
                  do {
                    sVar5 = local_80.size_active;
                    local_58 = (local_60->field_0).m128[0] + *pfVar13;
                    fStack_54 = (local_60->field_0).m128[1] + pfVar13[1];
                    fStack_50 = (local_60->field_0).m128[2] + pfVar13[2];
                    fStack_4c = pfVar13[3] + 0.0;
                    uVar11 = local_80.size_active + 1;
                    if (uVar10 < uVar11) {
                      uVar15 = uVar11;
                      uVar12 = uVar10;
                      if (uVar10 != 0) {
                        do {
                          uVar15 = uVar12 * 2 + (ulong)(uVar12 * 2 == 0);
                          uVar12 = uVar15;
                        } while (uVar15 < uVar11);
                      }
                      if (uVar10 != uVar15) {
                        pVVar7 = (Vec3fx *)alignedMalloc(uVar15 << 4,0x10);
                        if (sVar5 != 0) {
                          lVar8 = 0;
                          uVar10 = 0;
                          do {
                            puVar1 = (undefined8 *)((long)&pVVar14->field_0 + lVar8);
                            uVar4 = puVar1[1];
                            puVar2 = (undefined8 *)((long)&pVVar7->field_0 + lVar8);
                            *puVar2 = *puVar1;
                            puVar2[1] = uVar4;
                            uVar10 = uVar10 + 1;
                            lVar8 = lVar8 + 0x10;
                          } while (uVar10 < sVar5);
                        }
                        local_80.items = pVVar7;
                        alignedFree(pVVar14);
                        uVar10 = uVar15;
                        pVVar14 = pVVar7;
                        local_80.size_alloced = uVar15;
                      }
                    }
                    *(ulong *)&pVVar14[sVar5].field_0 = CONCAT44(fStack_54,local_58);
                    *(ulong *)((long)&pVVar14[sVar5].field_0 + 8) = CONCAT44(fStack_4c,fStack_50);
                    pfVar13 = pfVar13 + 4;
                    local_80.size_active = uVar11;
                  } while (pfVar13 != pfVar9);
                }
                std::
                vector<embree::vector_t<embree::Vec3fx,embree::aligned_allocator<embree::Vec3fx,16ul>>,std::allocator<embree::vector_t<embree::Vec3fx,embree::aligned_allocator<embree::Vec3fx,16ul>>>>
                ::
                emplace_back<embree::vector_t<embree::Vec3fx,embree::aligned_allocator<embree::Vec3fx,16ul>>>
                          ((vector<embree::vector_t<embree::Vec3fx,embree::aligned_allocator<embree::Vec3fx,16ul>>,std::allocator<embree::vector_t<embree::Vec3fx,embree::aligned_allocator<embree::Vec3fx,16ul>>>>
                            *)(plVar6 + 0xf),&local_80);
                alignedFree(local_80.items);
                (**(code **)(*plVar6 + 0x18))(plVar6);
              }
            }
            else {
              (**(code **)(*plVar6 + 0x10))(plVar6);
              local_80.size_active = 0;
              local_80.size_alloced = 0;
              local_80.items = (Vec3fx *)0x0;
              lVar8 = *(long *)(plVar6[0xf] + -0x18);
              if (lVar8 != 0) {
                pfVar13 = *(float **)(plVar6[0xf] + -8);
                pfVar9 = pfVar13 + lVar8 * 4;
                pVVar14 = (Vec3fx *)0x0;
                uVar10 = 0;
                do {
                  sVar5 = local_80.size_active;
                  local_58 = *pfVar13 + (local_60->field_0).m128[0];
                  fStack_54 = pfVar13[1] + (local_60->field_0).m128[1];
                  fStack_50 = pfVar13[2] + (local_60->field_0).m128[2];
                  fStack_4c = pfVar13[3] + (local_60->field_0).m128[3];
                  uVar11 = local_80.size_active + 1;
                  if (uVar10 < uVar11) {
                    uVar15 = uVar11;
                    uVar12 = uVar10;
                    if (uVar10 != 0) {
                      do {
                        uVar15 = uVar12 * 2 + (ulong)(uVar12 * 2 == 0);
                        uVar12 = uVar15;
                      } while (uVar15 < uVar11);
                    }
                    if (uVar10 != uVar15) {
                      pVVar7 = (Vec3fx *)alignedMalloc(uVar15 << 4,0x10);
                      if (sVar5 != 0) {
                        lVar8 = 0;
                        uVar10 = 0;
                        do {
                          puVar1 = (undefined8 *)((long)&pVVar14->field_0 + lVar8);
                          uVar4 = puVar1[1];
                          puVar2 = (undefined8 *)((long)&pVVar7->field_0 + lVar8);
                          *puVar2 = *puVar1;
                          puVar2[1] = uVar4;
                          uVar10 = uVar10 + 1;
                          lVar8 = lVar8 + 0x10;
                        } while (uVar10 < sVar5);
                      }
                      local_80.items = pVVar7;
                      alignedFree(pVVar14);
                      pVVar14 = pVVar7;
                      uVar10 = uVar15;
                      local_80.size_alloced = uVar15;
                    }
                  }
                  *(ulong *)&pVVar14[sVar5].field_0 = CONCAT44(fStack_54,local_58);
                  *(ulong *)((long)&pVVar14[sVar5].field_0 + 8) = CONCAT44(fStack_4c,fStack_50);
                  pfVar13 = pfVar13 + 4;
                  local_80.size_active = uVar11;
                } while (pfVar13 != pfVar9);
              }
              std::
              vector<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>,std::allocator<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>>>
              ::
              emplace_back<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>>
                        ((vector<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>,std::allocator<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>>>
                          *)(plVar6 + 0xe),
                         (vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>
                          *)&local_80);
              alignedFree(local_80.items);
              (**(code **)(*plVar6 + 0x18))(plVar6);
            }
          }
          else {
            (**(code **)(*plVar6 + 0x10))(plVar6);
            local_80.size_active = 0;
            local_80.size_alloced = 0;
            local_80.items = (Vec3fx *)0x0;
            lVar8 = *(long *)(plVar6[0xf] + -0x18);
            if (lVar8 != 0) {
              pfVar13 = *(float **)(plVar6[0xf] + -8);
              pfVar9 = pfVar13 + lVar8 * 4;
              pVVar14 = (Vec3fx *)0x0;
              uVar10 = 0;
              do {
                sVar5 = local_80.size_active;
                local_58 = *pfVar13 + (local_60->field_0).m128[0];
                fStack_54 = pfVar13[1] + (local_60->field_0).m128[1];
                fStack_50 = pfVar13[2] + (local_60->field_0).m128[2];
                fStack_4c = pfVar13[3] + (local_60->field_0).m128[3];
                uVar11 = local_80.size_active + 1;
                if (uVar10 < uVar11) {
                  uVar15 = uVar11;
                  uVar12 = uVar10;
                  if (uVar10 != 0) {
                    do {
                      uVar15 = uVar12 * 2 + (ulong)(uVar12 * 2 == 0);
                      uVar12 = uVar15;
                    } while (uVar15 < uVar11);
                  }
                  if (uVar10 != uVar15) {
                    pVVar7 = (Vec3fx *)alignedMalloc(uVar15 << 4,0x10);
                    if (sVar5 != 0) {
                      lVar8 = 0;
                      uVar10 = 0;
                      do {
                        puVar1 = (undefined8 *)((long)&pVVar14->field_0 + lVar8);
                        uVar4 = puVar1[1];
                        puVar2 = (undefined8 *)((long)&pVVar7->field_0 + lVar8);
                        *puVar2 = *puVar1;
                        puVar2[1] = uVar4;
                        uVar10 = uVar10 + 1;
                        lVar8 = lVar8 + 0x10;
                      } while (uVar10 < sVar5);
                    }
                    local_80.items = pVVar7;
                    alignedFree(pVVar14);
                    pVVar14 = pVVar7;
                    uVar10 = uVar15;
                    local_80.size_alloced = uVar15;
                  }
                }
                *(ulong *)&pVVar14[sVar5].field_0 = CONCAT44(fStack_54,local_58);
                *(ulong *)((long)&pVVar14[sVar5].field_0 + 8) = CONCAT44(fStack_4c,fStack_50);
                pfVar13 = pfVar13 + 4;
                local_80.size_active = uVar11;
              } while (pfVar13 != pfVar9);
            }
            std::
            vector<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>,std::allocator<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>>>
            ::
            emplace_back<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>>
                      ((vector<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>,std::allocator<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>>>
                        *)(plVar6 + 0xe),
                       (vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_> *
                       )&local_80);
            alignedFree(local_80.items);
            (**(code **)(*plVar6 + 0x18))(plVar6);
          }
        }
        else {
          (**(code **)(*plVar6 + 0x10))(plVar6);
          local_80.size_active = 0;
          local_80.size_alloced = 0;
          local_80.items = (Vec3fx *)0x0;
          lVar8 = *(long *)(plVar6[0xf] + -0x18);
          if (lVar8 != 0) {
            pfVar13 = *(float **)(plVar6[0xf] + -8);
            pfVar9 = pfVar13 + lVar8 * 4;
            pVVar14 = (Vec3fx *)0x0;
            uVar10 = 0;
            do {
              sVar5 = local_80.size_active;
              local_58 = *pfVar13 + (local_60->field_0).m128[0];
              fStack_54 = pfVar13[1] + (local_60->field_0).m128[1];
              fStack_50 = pfVar13[2] + (local_60->field_0).m128[2];
              fStack_4c = pfVar13[3] + (local_60->field_0).m128[3];
              uVar11 = local_80.size_active + 1;
              if (uVar10 < uVar11) {
                uVar15 = uVar11;
                uVar12 = uVar10;
                if (uVar10 != 0) {
                  do {
                    uVar15 = uVar12 * 2 + (ulong)(uVar12 * 2 == 0);
                    uVar12 = uVar15;
                  } while (uVar15 < uVar11);
                }
                if (uVar10 != uVar15) {
                  pVVar7 = (Vec3fx *)alignedMalloc(uVar15 << 4,0x10);
                  if (sVar5 != 0) {
                    lVar8 = 0;
                    uVar10 = 0;
                    do {
                      puVar1 = (undefined8 *)((long)&pVVar14->field_0 + lVar8);
                      uVar4 = puVar1[1];
                      puVar2 = (undefined8 *)((long)&pVVar7->field_0 + lVar8);
                      *puVar2 = *puVar1;
                      puVar2[1] = uVar4;
                      uVar10 = uVar10 + 1;
                      lVar8 = lVar8 + 0x10;
                    } while (uVar10 < sVar5);
                  }
                  local_80.items = pVVar7;
                  alignedFree(pVVar14);
                  pVVar14 = pVVar7;
                  uVar10 = uVar15;
                  local_80.size_alloced = uVar15;
                }
              }
              *(ulong *)&pVVar14[sVar5].field_0 = CONCAT44(fStack_54,local_58);
              *(ulong *)((long)&pVVar14[sVar5].field_0 + 8) = CONCAT44(fStack_4c,fStack_50);
              pfVar13 = pfVar13 + 4;
              local_80.size_active = uVar11;
            } while (pfVar13 != pfVar9);
          }
          std::
          vector<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>,std::allocator<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>>>
          ::
          emplace_back<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>>
                    ((vector<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>,std::allocator<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>>>
                      *)(plVar6 + 0xe),
                     (vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_> *)
                     &local_80);
          alignedFree(local_80.items);
          (**(code **)(*plVar6 + 0x18))(plVar6);
        }
      }
      else {
        (**(code **)(*plVar6 + 0x10))(plVar6);
        lVar8 = plVar6[0xd];
        if (plVar6[0xe] != lVar8) {
          uVar10 = 0;
          do {
            pNVar3 = *(Node **)(lVar8 + uVar10 * 8);
            local_40.ptr = pNVar3;
            if (pNVar3 != (Node *)0x0) {
              (*(pNVar3->super_RefCount)._vptr_RefCount[2])(pNVar3);
            }
            set_motion_vector(&local_40,dP);
            if (pNVar3 != (Node *)0x0) {
              (*(pNVar3->super_RefCount)._vptr_RefCount[3])(pNVar3);
            }
            uVar10 = uVar10 + 1;
            lVar8 = plVar6[0xd];
          } while (uVar10 < (ulong)(plVar6[0xe] - lVar8 >> 3));
        }
        (**(code **)(*plVar6 + 0x18))(plVar6);
      }
    }
    else {
      (**(code **)(*plVar6 + 0x10))(plVar6);
      pNVar3 = (Node *)plVar6[0x13];
      local_38.ptr = pNVar3;
      if (pNVar3 != (Node *)0x0) {
        (*(pNVar3->super_RefCount)._vptr_RefCount[2])(pNVar3);
      }
      set_motion_vector(&local_38,dP);
      if (pNVar3 != (Node *)0x0) {
        (*(pNVar3->super_RefCount)._vptr_RefCount[3])(pNVar3);
      }
      (**(code **)(*plVar6 + 0x18))(plVar6);
    }
  }
  return;
}

Assistant:

void SceneGraph::HairSetNode::print(std::ostream& cout, int depth) {
    cout << "HairSetNode @ " << this << " { closed = " << closed << " }" << std::endl;
  }